

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

TiledInputFile * __thiscall
Imf_3_4::MultiPartInputFile::getInputPart<Imf_3_4::TiledInputFile>
          (MultiPartInputFile *this,int partNumber)

{
  pthread_mutex_t *__mutex;
  pointer pPVar1;
  ulong uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar3;
  undefined8 *puVar4;
  TiledInputFile *pTVar5;
  ostream *poVar6;
  ArgExc *this_01;
  ulong uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  bool bVar8;
  file_storage f;
  __shared_ptr<Imf_3_4::TiledInputFile,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  ostream local_1a8 [376];
  
  uVar2 = (ulong)(uint)partNumber;
  if ((partNumber < 0) ||
     (__mutex = (pthread_mutex_t *)
                (this->_data).
                super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,
     uVar7 = (*(long *)((long)__mutex + 0x30) - __mutex[1].__align >> 5) * -0x5555555555555555,
     uVar7 < uVar2 || uVar7 - uVar2 == 0)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"MultiPartInputFile::getPart called with invalid part ",0x35);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,partNumber);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," on file with ",0xe);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," parts",6);
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_01,(stringstream *)&local_1b8);
    __cxa_throw(this_01,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_1b8._M_ptr = (TiledInputFile *)0x0;
  local_1b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pPVar1 = (((this->_data).
             super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->parts).
           super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((any *)((long)(pPVar1 + uVar2) + 0x50))->_M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0
     ) {
    pTVar5 = (TiledInputFile *)operator_new(0x20);
    TiledInputFile::TiledInputFile(pTVar5,&pPVar1[uVar2].data);
    std::__shared_ptr<Imf_3_4::TiledInputFile,_(__gnu_cxx::_Lock_policy)2>::
    reset<Imf_3_4::TiledInputFile>(&local_1b8,pTVar5);
    std::any::operator=((any *)((long)((((this->_data).
                                         super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->parts).
                                       super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar2) + 0x50),
                        (shared_ptr<Imf_3_4::TiledInputFile> *)&local_1b8);
    this_02._M_pi = local_1b8._M_refcount._M_pi;
LAB_0018e455:
    local_1b8._M_refcount._M_pi = this_02._M_pi;
    pTVar5 = local_1b8._M_ptr;
    this_02._M_pi = local_1b8._M_refcount._M_pi;
    if (local_1b8._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
    goto LAB_0018e462;
  }
  else {
    puVar4 = (undefined8 *)
             std::__any_caster<std::shared_ptr<Imf_3_4::TiledInputFile>>
                       ((any *)((long)(pPVar1 + uVar2) + 0x50));
    this_00._M_pi = local_1b8._M_refcount._M_pi;
    if (puVar4 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    pTVar5 = (TiledInputFile *)*puVar4;
    this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar4[1];
    local_1b8._M_ptr = pTVar5;
    if (this_02._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0018e455;
    if (__libc_single_threaded != '\0') {
      (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
      goto LAB_0018e455;
    }
    LOCK();
    (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
    UNLOCK();
    bVar8 = local_1b8._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1b8._M_refcount._M_pi = this_02._M_pi;
    if (bVar8) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
LAB_0018e462:
  pthread_mutex_unlock(__mutex);
  return pTVar5;
}

Assistant:

T*
MultiPartInputFile::getInputPart (int partNumber)
{
    if (partNumber < 0 || static_cast<size_t> (partNumber) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << partNumber << " on file with " << _data->parts.size () << " parts");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    using file_storage = std::shared_ptr<T>;
    file_storage f;
    if (!_data->parts[partNumber].file.has_value ())
    {
        // TODO: change to copy / value semantics
        // stupid make_shared and friend functions, can we remove this restriction?
        // f = std::make_shared<T> (&(_data->parts[partNumber].data));
        f.reset (new T (&(_data->parts[partNumber].data)));
        _data->parts[partNumber].file = f;
    }
    else
        f = std::any_cast<file_storage> (_data->parts[partNumber].file);

    // TODO: change to by reference / value semantics
    return f.get();
}